

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CImg.h
# Opt level: O3

void * cimg_library::CImgDisplay::_events_thread(void *arg)

{
  Display *pDVar1;
  undefined8 uVar2;
  int iVar3;
  uint i;
  ulong uVar4;
  XEvent event;
  timespec local_100;
  XEvent local_f0;
  
  if (cimg::X11_attr()::val == '\0') {
    iVar3 = __cxa_guard_acquire();
    if (iVar3 != 0) {
      cimg::X11_static::X11_static(&cimg::X11_attr::val);
      __cxa_atexit(cimg::X11_static::~X11_static,&cimg::X11_attr::val,&__dso_handle);
      __cxa_guard_release();
    }
  }
  pDVar1 = cimg::X11_attr::val.display;
  pthread_setcanceltype(0,(int *)0x0);
  pthread_setcancelstate(0,(int *)0x0);
  if (arg != (void *)0x0) {
    return (void *)0x0;
  }
  do {
    if (cimg::Mutex_attr()::val == '\0') {
      _events_thread();
    }
    pthread_mutex_lock((pthread_mutex_t *)(cimg::Mutex_attr()::val + 600));
    iVar3 = XCheckTypedEvent(pDVar1,0x21,&local_f0);
    if (iVar3 == 0) {
      iVar3 = XCheckMaskEvent(pDVar1,0x2807f,&local_f0);
      if (iVar3 != 0) goto LAB_0018d99f;
    }
    else {
LAB_0018d99f:
      uVar4 = 0;
      while( true ) {
        if (cimg::X11_attr()::val == '\0') {
          iVar3 = __cxa_guard_acquire(&cimg::X11_attr()::val);
          if (iVar3 != 0) {
            cimg::X11_static::X11_static(&cimg::X11_attr::val);
            __cxa_atexit(cimg::X11_static::~X11_static,&cimg::X11_attr::val,&__dso_handle);
            __cxa_guard_release(&cimg::X11_attr()::val);
          }
        }
        if (cimg::X11_attr::val.nb_wins <= uVar4) break;
        if (cimg::X11_attr()::val == '\0') {
          iVar3 = __cxa_guard_acquire(&cimg::X11_attr()::val);
          if (iVar3 != 0) {
            cimg::X11_static::X11_static(&cimg::X11_attr::val);
            __cxa_atexit(cimg::X11_static::~X11_static,&cimg::X11_attr::val,&__dso_handle);
            __cxa_guard_release(&cimg::X11_attr()::val);
          }
        }
        uVar2 = local_f0.xany.window;
        if (cimg::X11_attr::val.wins[uVar4]->_is_closed == false) {
          if (cimg::X11_attr()::val == '\0') {
            iVar3 = __cxa_guard_acquire(&cimg::X11_attr()::val);
            if (iVar3 != 0) {
              cimg::X11_static::X11_static(&cimg::X11_attr::val);
              __cxa_atexit(cimg::X11_static::~X11_static,&cimg::X11_attr::val,&__dso_handle);
              __cxa_guard_release(&cimg::X11_attr()::val);
            }
          }
          if (uVar2 == cimg::X11_attr::val.wins[uVar4]->_window) {
            if (cimg::X11_attr()::val == '\0') {
              iVar3 = __cxa_guard_acquire(&cimg::X11_attr()::val);
              if (iVar3 != 0) {
                cimg::X11_static::X11_static(&cimg::X11_attr::val);
                __cxa_atexit(cimg::X11_static::~X11_static,&cimg::X11_attr::val,&__dso_handle);
                __cxa_guard_release(&cimg::X11_attr()::val);
              }
            }
            _handle_events(cimg::X11_attr::val.wins[uVar4],&local_f0);
          }
        }
        uVar4 = uVar4 + 1;
      }
    }
    if (cimg::Mutex_attr()::val == '\0') {
      _events_thread();
    }
    pthread_mutex_unlock((pthread_mutex_t *)(cimg::Mutex_attr()::val + 600));
    pthread_testcancel();
    local_100.tv_sec = 0;
    local_100.tv_nsec = 8000000;
    nanosleep(&local_100,(timespec *)0x0);
  } while( true );
}

Assistant:

static void* _events_thread(void *arg) { // Thread to manage events for all opened display windows
      Display *const dpy = cimg::X11_attr().display;
      XEvent event;
      pthread_setcanceltype(PTHREAD_CANCEL_DEFERRED,0);
      pthread_setcancelstate(PTHREAD_CANCEL_ENABLE,0);
      if (!arg) for ( ; ; ) {
        cimg_lock_display();
        bool event_flag = XCheckTypedEvent(dpy,ClientMessage,&event);
        if (!event_flag) event_flag = XCheckMaskEvent(dpy,
                                                      ExposureMask | StructureNotifyMask | ButtonPressMask |
                                                      KeyPressMask | PointerMotionMask | EnterWindowMask |
                                                      LeaveWindowMask | ButtonReleaseMask | KeyReleaseMask,&event);
        if (event_flag)
          for (unsigned int i = 0; i<cimg::X11_attr().nb_wins; ++i)
            if (!cimg::X11_attr().wins[i]->_is_closed && event.xany.window==cimg::X11_attr().wins[i]->_window)
              cimg::X11_attr().wins[i]->_handle_events(&event);
        cimg_unlock_display();
        pthread_testcancel();
        cimg::sleep(8);
      }
      return 0;
    }